

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_scopes.cpp
# Opt level: O2

spv_result_t spvtools::val::ValidateScope(ValidationState_t *_,Instruction *inst,uint32_t scope)

{
  CapabilitySet *this;
  ushort uVar1;
  bool bVar2;
  Op opcode;
  int32_t iVar3;
  Instruction *inst_00;
  char *pcVar4;
  spv_result_t sVar5;
  string local_220;
  undefined1 local_200 [5];
  char local_1fb;
  spv_result_t local_30;
  
  uVar1 = (inst->inst_).opcode;
  ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_200,_,scope);
  if (local_1fb == '\0') {
    ValidationState_t::diag((DiagnosticStream *)local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar4 = spvOpcodeString((uint)uVar1);
    std::operator<<((ostream *)local_200,pcVar4);
    pcVar4 = ": expected scope to be a 32-bit int";
  }
  else {
    if (local_200[4] != false) {
      if ((uint)local_200._0_4_ < 7) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_200,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)local_200,"Invalid scope value:\n ");
      inst_00 = ValidationState_t::FindDef(_,scope);
      ValidationState_t::Disassemble_abi_cxx11_(&local_220,_,inst_00);
      std::operator<<((ostream *)local_200,(string *)&local_220);
      std::__cxx11::string::_M_dispose();
      sVar5 = local_30;
      goto LAB_0059b04f;
    }
    this = &_->module_capabilities_;
    bVar2 = EnumSet<spv::Capability>::contains(this,CapabilityShader);
    if ((!bVar2) ||
       (bVar2 = EnumSet<spv::Capability>::contains(this,CapabilityCooperativeMatrixNV), bVar2)) {
      bVar2 = EnumSet<spv::Capability>::contains(this,CapabilityShader);
      if (!bVar2) {
        return SPV_SUCCESS;
      }
      bVar2 = EnumSet<spv::Capability>::contains(this,CapabilityCooperativeMatrixNV);
      if (!bVar2) {
        return SPV_SUCCESS;
      }
      opcode = ValidationState_t::GetIdOpcode(_,scope);
      iVar3 = spvOpcodeIsConstant(opcode);
      if (iVar3 != 0) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_200,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)local_200,
                      "Scope ids must be constant or specialization constant when ");
      pcVar4 = "CooperativeMatrixNV capability is present";
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_200,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)local_200,"Scope ids must be OpConstant when Shader capability is "
                     );
      pcVar4 = "present";
    }
  }
  std::operator<<((ostream *)local_200,pcVar4);
  sVar5 = local_30;
LAB_0059b04f:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_200);
  return sVar5;
}

Assistant:

spv_result_t ValidateScope(ValidationState_t& _, const Instruction* inst,
                           uint32_t scope) {
  spv::Op opcode = inst->opcode();
  bool is_int32 = false, is_const_int32 = false;
  uint32_t value = 0;
  std::tie(is_int32, is_const_int32, value) = _.EvalInt32IfConst(scope);

  if (!is_int32) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode) << ": expected scope to be a 32-bit int";
  }

  if (!is_const_int32) {
    if (_.HasCapability(spv::Capability::Shader) &&
        !_.HasCapability(spv::Capability::CooperativeMatrixNV)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Scope ids must be OpConstant when Shader capability is "
             << "present";
    }
    if (_.HasCapability(spv::Capability::Shader) &&
        _.HasCapability(spv::Capability::CooperativeMatrixNV) &&
        !spvOpcodeIsConstant(_.GetIdOpcode(scope))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Scope ids must be constant or specialization constant when "
             << "CooperativeMatrixNV capability is present";
    }
  }

  if (is_const_int32 && !IsValidScope(value)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Invalid scope value:\n " << _.Disassemble(*_.FindDef(scope));
  }

  return SPV_SUCCESS;
}